

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLleft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *eps,
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *vec,int *nonz,int rn)

{
  uint *puVar1;
  int iVar2;
  int32_t iVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  fpclass_type fVar8;
  ulong uVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int *piVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  cpp_dec_float<50U,_int,_void> *pcVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar22;
  int *piVar23;
  int iVar24;
  cpp_dec_float<50U,_int,_void> *pcVar25;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  cpp_dec_float<50U,_int,_void> local_1e8;
  ulong local_1b0;
  cpp_dec_float<50U,_int,_void> local_1a8;
  cpp_dec_float<50U,_int,_void> local_168;
  int *local_130;
  ulong local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_120;
  cpp_dec_float<50U,_int,_void> local_118;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  int *local_d8;
  int *local_d0;
  pointer local_c8;
  int *local_c0;
  int *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  long lVar17;
  
  local_1a8.fpclass = cpp_dec_float_finite;
  local_1a8.prec_elem = 10;
  local_1a8.data._M_elems[0] = 0;
  local_1a8.data._M_elems[1] = 0;
  local_1a8.data._M_elems[2] = 0;
  local_1a8.data._M_elems[3] = 0;
  local_1a8.data._M_elems[4] = 0;
  local_1a8.data._M_elems[5] = 0;
  local_1a8.data._M_elems._24_5_ = 0;
  local_1a8.data._M_elems[7]._1_3_ = 0;
  local_1a8.data._M_elems[8] = 0;
  local_1a8.data._M_elems[9] = 0;
  local_1a8.exp = 0;
  local_1a8.neg = false;
  if (0 < rn) {
    local_c8 = (this->l).rval.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_d0 = (this->l).ridx;
    local_c0 = (this->l).rbeg;
    piVar23 = (this->l).rorig;
    local_b8 = (this->l).rperm;
    uVar9 = 0;
    do {
      iVar7 = local_b8[nonz[uVar9]];
      if (uVar9 == 0) {
        lVar17 = 0;
      }
      else {
        uVar20 = uVar9 & 0xffffffff;
        do {
          uVar21 = (uint)uVar20 - 1;
          uVar14 = uVar21 >> 1;
          uVar15 = (uint)uVar20;
          if (iVar7 <= nonz[uVar14]) break;
          nonz[uVar20] = nonz[uVar14];
          uVar20 = (ulong)uVar14;
          uVar15 = uVar14;
        } while (1 < uVar21);
        lVar17 = (long)(int)uVar15;
      }
      uVar9 = uVar9 + 1;
      nonz[lVar17] = iVar7;
    } while (uVar9 != (uint)rn);
    if (0 < rn) {
      local_130 = nonz + this->thedim;
      local_128 = 0;
      local_120 = vec;
      local_e0 = eps;
      local_d8 = piVar23;
      do {
        iVar7 = *nonz;
        local_1b0 = (ulong)(rn - 1U);
        iVar6 = nonz[local_1b0];
        iVar12 = 1;
        iVar24 = 0;
        if (3 < (uint)rn) {
          iVar24 = 0;
          do {
            iVar2 = nonz[iVar12];
            iVar19 = nonz[(long)iVar12 + 1];
            if (iVar19 < iVar2) {
              iVar11 = iVar12;
              iVar19 = iVar2;
              if (iVar2 <= iVar6) goto LAB_002b5db0;
            }
            else {
              if (iVar19 <= iVar6) goto LAB_002b5db0;
              iVar11 = iVar12 + 1;
            }
            nonz[iVar24] = iVar19;
            iVar12 = iVar11 * 2 + 1;
            iVar24 = iVar11;
          } while (iVar12 < (int)(rn - 2U));
        }
        if ((iVar12 < (int)(rn - 1U)) && (iVar6 < nonz[iVar12])) {
          nonz[iVar24] = nonz[iVar12];
          iVar24 = iVar12;
        }
LAB_002b5db0:
        nonz[iVar24] = iVar6;
        iVar7 = piVar23[iVar7];
        local_168.data._M_elems._32_8_ =
             *(undefined8 *)(local_120[iVar7].m_backend.data._M_elems + 8);
        local_168.data._M_elems._0_16_ =
             *(undefined1 (*) [16])local_120[iVar7].m_backend.data._M_elems;
        puVar1 = local_120[iVar7].m_backend.data._M_elems + 4;
        local_168.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar4 = *(undefined8 *)(puVar1 + 2);
        local_168.data._M_elems._24_5_ = SUB85(uVar4,0);
        local_168.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_1e8.exp = local_120[iVar7].m_backend.exp;
        local_168.neg = local_120[iVar7].m_backend.neg;
        local_168.fpclass = local_120[iVar7].m_backend.fpclass;
        local_168.prec_elem = local_120[iVar7].m_backend.prec_elem;
        uVar4 = *(undefined8 *)(local_120[iVar7].m_backend.data._M_elems + 8);
        local_1e8.data._M_elems._32_5_ = SUB85(uVar4,0);
        local_1e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_1e8.data._M_elems._0_8_ = *(undefined8 *)local_120[iVar7].m_backend.data._M_elems;
        local_1e8.data._M_elems._8_8_ =
             *(undefined8 *)(local_120[iVar7].m_backend.data._M_elems + 2);
        puVar1 = local_120[iVar7].m_backend.data._M_elems + 4;
        local_1e8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar4 = *(undefined8 *)(puVar1 + 2);
        local_1e8.data._M_elems._24_5_ = SUB85(uVar4,0);
        local_1e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_68.data._M_elems._0_8_ = *(undefined8 *)(local_e0->m_backend).data._M_elems;
        local_68.data._M_elems._8_8_ = *(undefined8 *)((local_e0->m_backend).data._M_elems + 2);
        local_68.data._M_elems._16_8_ = *(undefined8 *)((local_e0->m_backend).data._M_elems + 4);
        local_68.data._M_elems._24_8_ = *(undefined8 *)((local_e0->m_backend).data._M_elems + 6);
        local_68.data._M_elems._32_8_ = *(undefined8 *)((local_e0->m_backend).data._M_elems + 8);
        local_68.exp = (local_e0->m_backend).exp;
        local_68.neg = (local_e0->m_backend).neg;
        local_68.fpclass = (local_e0->m_backend).fpclass;
        local_68.prec_elem = (local_e0->m_backend).prec_elem;
        local_1e8.prec_elem = local_168.prec_elem;
        local_1e8.fpclass = local_168.fpclass;
        local_1e8.neg = local_168.neg;
        if ((local_168.neg == true) &&
           (local_1e8.data._M_elems[0] != 0 || local_168.fpclass != cpp_dec_float_finite)) {
          local_1e8.neg = false;
        }
        local_168.exp = local_1e8.exp;
        if ((local_68.fpclass == cpp_dec_float_NaN || local_168.fpclass == cpp_dec_float_NaN) ||
           (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_1e8,&local_68), iVar6 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (&local_120[iVar7].m_backend,0);
        }
        else {
          local_130[-1] = iVar7;
          local_130 = local_130 + -1;
          local_128 = (ulong)((int)local_128 + 1);
          iVar6 = local_c0[iVar7];
          iVar24 = local_c0[(long)iVar7 + 1] - iVar6;
          if (iVar24 != 0 && iVar6 <= local_c0[(long)iVar7 + 1]) {
            piVar13 = local_d0 + iVar6;
            pcVar25 = &local_c8[iVar6].m_backend;
            do {
              iVar7 = *piVar13;
              pnVar22 = local_120 + iVar7;
              local_1a8.data._M_elems._32_8_ =
                   *(undefined8 *)(local_120[iVar7].m_backend.data._M_elems + 8);
              local_1a8.data._M_elems._0_8_ =
                   *(undefined8 *)local_120[iVar7].m_backend.data._M_elems;
              local_1a8.data._M_elems._8_8_ =
                   *(undefined8 *)(local_120[iVar7].m_backend.data._M_elems + 2);
              puVar1 = local_120[iVar7].m_backend.data._M_elems + 4;
              local_1a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
              uVar4 = *(undefined8 *)(puVar1 + 2);
              local_1a8.data._M_elems._24_5_ = SUB85(uVar4,0);
              local_1a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
              local_1a8.exp = local_120[iVar7].m_backend.exp;
              local_1a8.neg = local_120[iVar7].m_backend.neg;
              local_1a8.fpclass = local_120[iVar7].m_backend.fpclass;
              local_1a8.prec_elem = local_120[iVar7].m_backend.prec_elem;
              if (local_1a8.fpclass == cpp_dec_float_NaN) {
LAB_002b5fe7:
                auVar5 = (undefined1  [16])local_168.data._M_elems._0_16_;
                local_1e8.fpclass = cpp_dec_float_finite;
                local_1e8.prec_elem = 10;
                local_1e8.data._M_elems[0] = 0;
                local_1e8.data._M_elems[1] = 0;
                local_1e8.data._M_elems[2] = 0;
                local_1e8.data._M_elems[3] = 0;
                local_1e8.data._M_elems[4] = 0;
                local_1e8.data._M_elems[5] = 0;
                local_1e8.data._M_elems._24_5_ = 0;
                local_1e8.data._M_elems[7]._1_3_ = 0;
                local_1e8.data._M_elems._32_5_ = 0;
                local_1e8.data._M_elems[9]._1_3_ = 0;
                local_1e8.exp = 0;
                local_1e8.neg = false;
                pcVar18 = &local_168;
                if (&local_1e8 != pcVar25) {
                  local_1e8.data._M_elems._32_5_ = local_168.data._M_elems._32_5_;
                  local_1e8.data._M_elems[9]._1_3_ = local_168.data._M_elems[9]._1_3_;
                  local_1e8.data._M_elems[4] = local_168.data._M_elems[4];
                  local_1e8.data._M_elems[5] = local_168.data._M_elems[5];
                  local_1e8.data._M_elems._24_5_ = local_168.data._M_elems._24_5_;
                  local_1e8.data._M_elems[7]._1_3_ = local_168.data._M_elems[7]._1_3_;
                  local_1e8.data._M_elems[0] = local_168.data._M_elems[0];
                  local_1e8.data._M_elems[1] = local_168.data._M_elems[1];
                  local_1e8.data._M_elems[2] = local_168.data._M_elems[2];
                  local_1e8.data._M_elems[3] = local_168.data._M_elems[3];
                  local_1e8.exp = local_168.exp;
                  local_1e8.neg = local_168.neg;
                  local_1e8.prec_elem = local_168.prec_elem;
                  local_1e8.fpclass = local_168.fpclass;
                  pcVar18 = pcVar25;
                }
                local_168.data._M_elems._0_16_ = auVar5;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                          (&local_1e8,pcVar18);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_1a8,&local_1e8);
                fVar8 = cpp_dec_float_NaN;
                if (local_1a8.fpclass == cpp_dec_float_NaN) {
LAB_002b60af:
                  local_118.data._M_elems._32_5_ = local_1a8.data._M_elems._32_5_;
                  local_118.data._M_elems[9]._1_3_ = local_1a8.data._M_elems[9]._1_3_;
                  local_118.data._M_elems[4] = local_1a8.data._M_elems[4];
                  local_118.data._M_elems[5] = local_1a8.data._M_elems[5];
                  local_118.data._M_elems._24_5_ = local_1a8.data._M_elems._24_5_;
                  local_118.data._M_elems[7]._1_3_ = local_1a8.data._M_elems[7]._1_3_;
                  local_118.data._M_elems[0] = local_1a8.data._M_elems[0];
                  local_118.data._M_elems[1] = local_1a8.data._M_elems[1];
                  local_118.data._M_elems[2] = local_1a8.data._M_elems[2];
                  local_118.data._M_elems[3] = local_1a8.data._M_elems[3];
                  pcVar18 = &local_1a8;
                  iVar7 = local_1a8.exp;
                  bVar10 = local_1a8.neg;
                }
                else {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<long_long>(&local_1e8,0,(type *)0x0);
                  iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (&local_1a8,&local_1e8);
                  if (iVar7 != 0) {
                    fVar8 = local_1a8.fpclass;
                    goto LAB_002b60af;
                  }
                  local_118.fpclass = cpp_dec_float_finite;
                  local_118.prec_elem = 10;
                  local_118.data._M_elems[0] = 0;
                  local_118.data._M_elems[1] = 0;
                  local_118.data._M_elems[2] = 0;
                  local_118.data._M_elems[3] = 0;
                  local_118.data._M_elems[4] = 0;
                  local_118.data._M_elems[5] = 0;
                  local_118.data._M_elems._24_5_ = 0;
                  local_118.data._M_elems[7]._1_3_ = 0;
                  local_118.data._M_elems._32_5_ = 0;
                  local_118.data._M_elems[9]._1_3_ = 0;
                  local_118.exp = 0;
                  local_118.neg = false;
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)&local_118,1e-100);
                  pcVar18 = &local_118;
                  fVar8 = local_118.fpclass;
                  iVar7 = local_118.exp;
                  bVar10 = local_118.neg;
                }
                iVar3 = pcVar18->prec_elem;
                *(ulong *)((pnVar22->m_backend).data._M_elems + 8) =
                     CONCAT35(local_118.data._M_elems[9]._1_3_,local_118.data._M_elems._32_5_);
                *(undefined8 *)((pnVar22->m_backend).data._M_elems + 4) =
                     local_118.data._M_elems._16_8_;
                *(ulong *)((pnVar22->m_backend).data._M_elems + 6) =
                     CONCAT35(local_118.data._M_elems[7]._1_3_,local_118.data._M_elems._24_5_);
                *(undefined8 *)(pnVar22->m_backend).data._M_elems = local_118.data._M_elems._0_8_;
                *(undefined8 *)((pnVar22->m_backend).data._M_elems + 2) =
                     local_118.data._M_elems._8_8_;
                (pnVar22->m_backend).exp = iVar7;
                (pnVar22->m_backend).neg = bVar10;
                (pnVar22->m_backend).fpclass = fVar8;
                (pnVar22->m_backend).prec_elem = iVar3;
                uVar4 = local_1a8.data._M_elems._16_8_;
              }
              else {
                local_b0 = pnVar22;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>(&local_1e8,0,(type *)0x0);
                pnVar22 = local_b0;
                iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_1a8,&local_1e8);
                auVar5 = (undefined1  [16])local_168.data._M_elems._0_16_;
                if (iVar6 != 0) goto LAB_002b5fe7;
                local_118.data._M_elems[0] = local_168.data._M_elems[0];
                local_118.data._M_elems[1] = local_168.data._M_elems[1];
                uVar4 = local_118.data._M_elems._0_8_;
                local_118.data._M_elems[2] = local_168.data._M_elems[2];
                local_118.data._M_elems[3] = local_168.data._M_elems[3];
                local_118.data._M_elems._32_5_ = local_168.data._M_elems._32_5_;
                local_118.data._M_elems[9]._1_3_ = local_168.data._M_elems[9]._1_3_;
                local_118.data._M_elems[4] = local_168.data._M_elems[4];
                local_118.data._M_elems[5] = local_168.data._M_elems[5];
                local_118.data._M_elems._24_5_ = local_168.data._M_elems._24_5_;
                local_118.data._M_elems[7]._1_3_ = local_168.data._M_elems[7]._1_3_;
                local_118.exp = local_168.exp;
                local_118.prec_elem = local_168.prec_elem;
                local_118.fpclass = local_168.fpclass;
                local_118.data._M_elems[0] = auVar5._0_4_;
                local_118.neg = local_168.neg;
                if (local_118.data._M_elems[0] != 0 || local_168.fpclass != cpp_dec_float_finite) {
                  local_118.neg = (bool)(local_168.neg ^ 1);
                }
                local_1e8.fpclass = cpp_dec_float_finite;
                local_1e8.prec_elem = 10;
                local_1e8.data._M_elems[0] = 0;
                local_1e8.data._M_elems[1] = 0;
                local_1e8.data._M_elems[2] = 0;
                local_1e8.data._M_elems[3] = 0;
                local_1e8.data._M_elems[4] = 0;
                local_1e8.data._M_elems[5] = 0;
                local_1e8.data._M_elems._24_5_ = 0;
                local_1e8.data._M_elems[7]._1_3_ = 0;
                local_1e8.data._M_elems._32_5_ = 0;
                local_1e8.data._M_elems[9]._1_3_ = 0;
                local_1e8.exp = 0;
                local_1e8.neg = false;
                pcVar18 = &local_118;
                if (&local_1e8 != pcVar25) {
                  local_1e8.data._M_elems[4] = local_168.data._M_elems[4];
                  local_1e8.data._M_elems[5] = local_168.data._M_elems[5];
                  local_1e8.data._M_elems._24_5_ = local_168.data._M_elems._24_5_;
                  local_1e8.data._M_elems[7]._1_3_ = local_168.data._M_elems[7]._1_3_;
                  local_1e8.data._M_elems[0] = local_168.data._M_elems[0];
                  local_1e8.data._M_elems[1] = local_168.data._M_elems[1];
                  local_1e8.data._M_elems[2] = local_168.data._M_elems[2];
                  local_1e8.data._M_elems[3] = local_168.data._M_elems[3];
                  local_1e8.exp = local_168.exp;
                  local_1e8.fpclass = local_168.fpclass;
                  local_1e8.prec_elem = local_168.prec_elem;
                  pcVar18 = pcVar25;
                  local_1e8.data._M_elems._32_5_ = local_118.data._M_elems._32_5_;
                  local_1e8.data._M_elems[9]._1_3_ = local_118.data._M_elems[9]._1_3_;
                  local_1e8.neg = local_118.neg;
                }
                local_168.data._M_elems._0_16_ = auVar5;
                local_118.data._M_elems._0_8_ = uVar4;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                          (&local_1e8,pcVar18);
                local_1a8.data._M_elems[9]._1_3_ = local_1e8.data._M_elems[9]._1_3_;
                local_1a8.data._M_elems._32_5_ = local_1e8.data._M_elems._32_5_;
                uVar4._0_4_ = local_1e8.data._M_elems[4];
                uVar4._4_4_ = local_1e8.data._M_elems[5];
                local_1a8.data._M_elems[4] = local_1e8.data._M_elems[4];
                local_1a8.data._M_elems[5] = local_1e8.data._M_elems[5];
                local_1a8.data._M_elems._24_5_ = local_1e8.data._M_elems._24_5_;
                local_1a8.data._M_elems[7]._1_3_ = local_1e8.data._M_elems[7]._1_3_;
                local_1a8.data._M_elems[0] = local_1e8.data._M_elems[0];
                local_1a8.data._M_elems[1] = local_1e8.data._M_elems[1];
                local_1a8.data._M_elems[2] = local_1e8.data._M_elems[2];
                local_1a8.data._M_elems[3] = local_1e8.data._M_elems[3];
                local_1a8.exp = local_1e8.exp;
                local_1a8.neg = local_1e8.neg;
                local_1a8.prec_elem = local_1e8.prec_elem;
                local_1a8.fpclass = local_1e8.fpclass;
                local_a8.data._M_elems._32_8_ =
                     *(undefined8 *)((local_e0->m_backend).data._M_elems + 8);
                local_a8.data._M_elems._0_8_ = *(undefined8 *)(local_e0->m_backend).data._M_elems;
                local_a8.data._M_elems._8_8_ =
                     *(undefined8 *)((local_e0->m_backend).data._M_elems + 2);
                local_a8.data._M_elems._16_8_ =
                     *(undefined8 *)((local_e0->m_backend).data._M_elems + 4);
                local_a8.data._M_elems._24_8_ =
                     *(undefined8 *)((local_e0->m_backend).data._M_elems + 6);
                local_a8.exp = (local_e0->m_backend).exp;
                local_a8.neg = (local_e0->m_backend).neg;
                local_a8.fpclass = (local_e0->m_backend).fpclass;
                local_a8.prec_elem = (local_e0->m_backend).prec_elem;
                if ((local_1e8.neg == true) &&
                   (local_1e8.data._M_elems[0] != 0 || local_1e8.fpclass != cpp_dec_float_finite)) {
                  local_1e8.neg = false;
                }
                if ((local_a8.fpclass != cpp_dec_float_NaN && local_1e8.fpclass != cpp_dec_float_NaN
                    ) && (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                  compare(&local_1e8,&local_a8),
                         uVar4 = local_1a8.data._M_elems._16_8_, 0 < iVar6)) {
                  *(undefined8 *)((pnVar22->m_backend).data._M_elems + 8) =
                       local_1a8.data._M_elems._32_8_;
                  *(undefined8 *)((pnVar22->m_backend).data._M_elems + 4) =
                       local_1a8.data._M_elems._16_8_;
                  *(ulong *)((pnVar22->m_backend).data._M_elems + 6) =
                       CONCAT35(local_1a8.data._M_elems[7]._1_3_,local_1a8.data._M_elems._24_5_);
                  *(undefined8 *)(pnVar22->m_backend).data._M_elems = local_1a8.data._M_elems._0_8_;
                  *(undefined8 *)((pnVar22->m_backend).data._M_elems + 2) =
                       local_1a8.data._M_elems._8_8_;
                  (pnVar22->m_backend).exp = local_1a8.exp;
                  (pnVar22->m_backend).neg = local_1a8.neg;
                  (pnVar22->m_backend).fpclass = local_1a8.fpclass;
                  (pnVar22->m_backend).prec_elem = local_1a8.prec_elem;
                  iVar7 = local_b8[iVar7];
                  uVar14 = (uint)local_1b0;
                  uVar15 = uVar14;
                  if (0 < (int)uVar14) {
                    do {
                      uVar16 = (uint)local_1b0 - 1;
                      uVar21 = uVar16 >> 1;
                      uVar15 = (uint)local_1b0;
                      if (iVar7 <= nonz[uVar21]) break;
                      nonz[local_1b0 & 0xffffffff] = nonz[uVar21];
                      local_1b0 = (ulong)uVar21;
                      uVar15 = uVar21;
                    } while (1 < uVar16);
                  }
                  local_1b0 = (ulong)(uVar14 + 1);
                  nonz[(int)uVar15] = iVar7;
                }
              }
              local_1a8.data._M_elems._16_8_ = uVar4;
              piVar13 = piVar13 + 1;
              pcVar25 = pcVar25 + 1;
              bVar10 = 1 < iVar24;
              piVar23 = local_d8;
              iVar24 = iVar24 + -1;
            } while (bVar10);
          }
        }
        rn = (int)local_1b0;
        if (rn < 1) {
          iVar7 = (int)local_128;
          if (iVar7 < 1) {
            return iVar7;
          }
          lVar17 = 0;
          do {
            nonz[lVar17] = local_130[lVar17];
            lVar17 = lVar17 + 1;
          } while (iVar7 != (int)lVar17);
          return iVar7;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

int CLUFactor<R>::solveLleft(R eps, R* vec, int* nonz, int rn)
{
   int i, j, k, n;
   int r;
   R x, y;
   R* rval, *val;
   int* ridx, *idx;
   int* rbeg;
   int* rorig, *rperm;
   int* last;

   ridx  = l.ridx;
   rval  = l.rval.data();
   rbeg  = l.rbeg;
   rorig = l.rorig;
   rperm = l.rperm;
   n     = 0;

   i = l.firstUpdate - 1;
#ifndef SOPLEX_WITH_L_ROWS
#pragma warn "Not yet implemented, define SOPLEX_WITH_L_ROWS"
   R*   lval = l.val.data();
   int*    lidx = l.idx;
   int*    lrow = l.row;
   int*    lbeg = l.start;

   for(; i >= 0; --i)
   {
      k   = lbeg[i];
      val = &lval[k];
      idx = &lidx[k];
      x   = 0;

      for(j = lbeg[i + 1]; j > k; --j)
         x += vec[*idx++] * (*val++);

      vec[lrow[i]] -= x;
   }

#else

   /*  move rhsidx to a heap
    */
   for(i = 0; i < rn;)
      enQueueMax(nonz, &i, rperm[nonz[i]]);

   last = nonz + thedim;

   while(rn > 0)
   {
      i = deQueueMax(nonz, &rn);
      r = rorig[i];
      x = vec[r];

      if(isNotZero(x, eps))
      {
         *(--last) = r;
         n++;
         k = rbeg[r];
         j = rbeg[r + 1] - k;
         val = &rval[k];
         idx = &ridx[k];

         while(j-- > 0)
         {
            assert(l.rperm[*idx] < i);
            int m = *idx++;
            y = vec[m];

            if(y == 0)
            {
               y = -x * *val++;

               if(isNotZero(y, eps))
               {
                  vec[m] = y;
                  enQueueMax(nonz, &rn, rperm[m]);
               }
            }
            else
            {
               y -= x * *val++;
               vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
      else
         vec[r] = 0;
   }

   for(i = 0; i < n; ++i)
      *nonz++ = *last++;

#endif

   return n;
}